

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O3

void aom_int_pro_col_sse2
               (int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  long lVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  
  if (0 < height) {
    uVar2 = 0;
    do {
      sVar3 = 0;
      sVar5 = 0;
      sVar7 = 0;
      sVar9 = 0;
      sVar4 = 0;
      sVar6 = 0;
      sVar8 = 0;
      sVar10 = 0;
      if (0 < width) {
        lVar1 = 0;
        do {
          auVar11 = psadbw(*(undefined1 (*) [16])(ref + lVar1),(undefined1  [16])0x0);
          sVar3 = sVar3 + auVar11._0_2_;
          sVar5 = sVar5 + auVar11._2_2_;
          sVar7 = sVar7 + auVar11._8_2_;
          sVar9 = sVar9 + auVar11._10_2_;
          lVar1 = lVar1 + 0x10;
          sVar4 = sVar3;
          sVar6 = sVar5;
          sVar8 = sVar7;
          sVar10 = sVar9;
        } while ((int)lVar1 < width);
      }
      vbuf[uVar2] = (int16_t)(CONCAT22(sVar10 + sVar6,sVar8 + sVar4) >> ((byte)norm_factor & 0x1f));
      uVar2 = uVar2 + 1;
      ref = ref + ref_stride;
    } while (uVar2 != (uint)height);
  }
  return;
}

Assistant:

void aom_int_pro_col_sse2(int16_t *vbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width to be multiple of 16.
  assert(width % 16 == 0);

  for (int ht = 0; ht < height; ht++) {
    const uint8_t *ref_tmp = ref + (ht * ref_stride);
    __m128i zero = _mm_setzero_si128();
    __m128i s0 = zero;
    __m128i s1, src_line;
    for (int i = 0; i < width; i += 16) {
      src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      s1 = _mm_sad_epu8(src_line, zero);
      s0 = _mm_add_epi16(s0, s1);
      ref_tmp += 16;
    }

    s1 = _mm_srli_si128(s0, 8);
    s0 = _mm_add_epi16(s0, s1);
    vbuf[ht] = _mm_cvtsi128_si32(s0) >> norm_factor;
  }
}